

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O0

size_t SerializeMe::BufferSize<Point3D>(Point3D *val)

{
  Serializer<Point3D> local_21;
  anon_class_8_1_736c71da local_20;
  anon_class_8_1_736c71da func;
  size_t total_size;
  Point3D *val_local;
  
  func.total_size = (size_t *)0x0;
  local_20.total_size = (size_t *)&func;
  Serializer<Point3D>::operator()(&local_21,val,&local_20);
  return (size_t)func.total_size;
}

Assistant:

inline size_t BufferSize(const T& val)
{
  if constexpr (is_arithmetic<T>())
  {
    return sizeof(T);
  }
  else
  {
    static_assert(is_serializer_defined<T>(), "Missing specialization of class "
                                              "Serialize<>. Check errors below");

    if constexpr (is_serializer_defined<T>())
    {
      size_t total_size = 0;
      auto func = [&total_size](auto const& field) { total_size += BufferSize(field); };

      Serializer<T>().operator()(const_cast<T&>(val), func);
      return total_size;
    }
  }
}